

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall specialOps_degC_Test::TestBody(specialOps_degC_Test *this)

{
  bool bVar1;
  char *message;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  AssertHelper local_60;
  Message local_58 [3];
  precise_unit local_40;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  precise_unit res;
  specialOps_degC_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )units::precise_unit::pow((precise_unit *)units::precise::degC,in_XMM0_Qa,in_XMM1_Qa);
  local_40 = units::root((precise_unit *)&gtest_ar.message_,2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_30,"root(res, 2)","precise::degC",&local_40,
             (precise_unit *)units::precise::degC);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x357,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(specialOps, degC)
{
    auto res = precise::degC.pow(2);
    EXPECT_EQ(root(res, 2), precise::degC);
}